

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cpp
# Opt level: O0

void __thiscall RPCClient::~RPCClient(RPCClient *this)

{
  RPCClient *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->_func_map);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
  ::~map(&this->_func_call_map);
  std::shared_ptr<cppnet::CNSocket>::~shared_ptr(&this->_socket);
  std::__cxx11::string::~string((string *)&this->_ip);
  cppnet::CppNet::~CppNet(&this->_net);
  std::shared_ptr<ParsePackage>::~shared_ptr(&this->_parse_package);
  std::shared_ptr<InfoRouter>::~shared_ptr(&this->_info_router);
  return;
}

Assistant:

RPCClient::~RPCClient() {
}